

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission.cpp
# Opt level: O1

void __thiscall
DIntermissionController::DIntermissionController
          (DIntermissionController *this,FIntermissionDescriptor *Desc,bool DeleteDesc,BYTE state)

{
  bool bVar1;
  
  DObject::DObject(&this->super_DObject);
  (this->super_DObject)._vptr_DObject = (_func_int **)&PTR_StaticType_006f0458;
  this->mDesc = Desc;
  this->mDeleteDesc = DeleteDesc;
  this->mIndex = 0;
  this->mSentAdvance = false;
  (this->mScreen).field_0.p = (DIntermissionScreen *)0x0;
  this->mFirst = true;
  this->mAdvance = false;
  this->mGameState = state;
  bVar1 = NextPage(this);
  if (!bVar1) {
    wipegamestate = GS_FINALE;
  }
  return;
}

Assistant:

DIntermissionController::DIntermissionController(FIntermissionDescriptor *Desc, bool DeleteDesc, BYTE state)
{
	mDesc = Desc;
	mDeleteDesc = DeleteDesc;
	mIndex = 0;
	mAdvance = false;
	mSentAdvance = false;
	mScreen = NULL;
	mFirst = true;
	mGameState = state;

	// If the intermission finishes straight away then cancel the wipe.
	if(!NextPage())
		wipegamestate = GS_FINALE;
}